

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O1

void Js::InlineCache::VerifyRegistrationForInvalidation
               (InlineCache *cache,ScriptContext *scriptContext,PropertyId propertyId)

{
  InlineCache **ppIVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined4 *puVar6;
  byte bVar7;
  bool bVar8;
  
  if (((undefined1  [24])((undefined1  [24])cache->u & (undefined1  [24])0x1) ==
       (undefined1  [24])0x0) || (bVar8 = true, (cache->u).local.typeWithoutProperty == (Type *)0x0)
     ) {
    bVar8 = (~*(uint *)((long)&cache->u + 8) & 0xd) == 0;
  }
  bVar7 = (~(cache->u).accessor.field_1.rawUInt16 & 0xb) == 0 | *(byte *)&cache->u;
  ppIVar1 = cache->invalidationListSlotPtr;
  if (ppIVar1 == (InlineCache **)0x0) {
    bVar3 = false;
    bVar4 = false;
  }
  else {
    bVar3 = ThreadContext::IsProtoInlineCacheRegistered
                      (scriptContext->threadContext,cache,propertyId);
    bVar4 = ThreadContext::IsStoreFieldInlineCacheRegistered
                      (scriptContext->threadContext,cache,propertyId);
  }
  if ((bVar7 & bVar8) == 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x238,"(howManyInvalidationsNeeded <= 1)",
                                "howManyInvalidationsNeeded <= 1");
    if (!bVar5) goto LAB_00981dc8;
    *puVar6 = 0;
  }
  if ((~(bVar7 | bVar8) & 1) == 0 && ppIVar1 == (InlineCache **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x239,"((howManyInvalidationsNeeded == 0) || hasListSlotPtr)",
                                "(howManyInvalidationsNeeded == 0) || hasListSlotPtr");
    if (!bVar5) goto LAB_00981dc8;
    *puVar6 = 0;
  }
  if ((~bVar7 & 1) == 0 && bVar3 == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x23a,"(!needsProtoInvalidation || isProtoRegistered)",
                                "!needsProtoInvalidation || isProtoRegistered");
    if (!bVar5) goto LAB_00981dc8;
    *puVar6 = 0;
  }
  if (bVar8 == true && bVar4 == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x23b,"(!needsStoreFieldInvalidation || isStoreFieldRegistered)",
                                "!needsStoreFieldInvalidation || isStoreFieldRegistered");
    if (!bVar8) goto LAB_00981dc8;
    *puVar6 = 0;
  }
  if ((ppIVar1 != (InlineCache **)0x0) && (bVar3 == false && bVar4 == false)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x23c,"(!hasListSlotPtr || howManyRegistrations > 0)",
                                "!hasListSlotPtr || howManyRegistrations > 0");
    if (!bVar8) goto LAB_00981dc8;
    *puVar6 = 0;
  }
  if ((ppIVar1 != (InlineCache **)0x0) && (*cache->invalidationListSlotPtr != cache)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x23d,
                                "(!hasListSlotPtr || (*cache->invalidationListSlotPtr) == cache)",
                                "!hasListSlotPtr || (*cache->invalidationListSlotPtr) == cache");
    if (!bVar8) {
LAB_00981dc8:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  return;
}

Assistant:

void InlineCache::VerifyRegistrationForInvalidation(const InlineCache* cache, ScriptContext* scriptContext, Js::PropertyId propertyId)
    {
        bool needsProtoInvalidation = cache->NeedsToBeRegisteredForProtoInvalidation();
        bool needsStoreFieldInvalidation = cache->NeedsToBeRegisteredForStoreFieldInvalidation();
        int howManyInvalidationsNeeded = (int)needsProtoInvalidation + (int)needsStoreFieldInvalidation;
        bool hasListSlotPtr = cache->invalidationListSlotPtr != nullptr;
        bool isProtoRegistered = hasListSlotPtr ? scriptContext->GetThreadContext()->IsProtoInlineCacheRegistered(cache, propertyId) : false;
        bool isStoreFieldRegistered = hasListSlotPtr ? scriptContext->GetThreadContext()->IsStoreFieldInlineCacheRegistered(cache, propertyId) : false;
        int howManyRegistrations = (int)isProtoRegistered + (int)isStoreFieldRegistered;

        Assert(howManyInvalidationsNeeded <= 1);
        Assert((howManyInvalidationsNeeded == 0) || hasListSlotPtr);
        Assert(!needsProtoInvalidation || isProtoRegistered);
        Assert(!needsStoreFieldInvalidation || isStoreFieldRegistered);
        Assert(!hasListSlotPtr || howManyRegistrations > 0);
        Assert(!hasListSlotPtr || (*cache->invalidationListSlotPtr) == cache);
    }